

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_model_component.cpp
# Opt level: O0

ON_wString __thiscall ON_ModelComponent::NameReferencePrefix(ON_ModelComponent *this,wchar_t *name)

{
  wchar_t *name_00;
  undefined1 local_48 [40];
  wchar_t *s;
  wchar_t *tail;
  wchar_t *name_local;
  ON_wString *name_reference;
  
  tail = name;
  name_local = (wchar_t *)this;
  if ((name == (wchar_t *)0x0) || (s = name, *name == L'\0')) {
    ON_wString::ON_wString((ON_wString *)this,&ON_wString::EmptyString);
  }
  else {
    for (; *s != L'\0'; s = s + 1) {
    }
    while (tail < s) {
      s = s + -1;
      local_48._32_8_ = IsReferencePrefixDelimiter(s);
      if ((wchar_t *)local_48._32_8_ != (wchar_t *)0x0) {
        local_48[0x1f] = 0;
        ON_wString::ON_wString((ON_wString *)this,tail);
        ON_wString::SetLength((ON_wString *)this,(long)s - (long)tail >> 2);
        name_00 = ON_wString::operator_cast_to_wchar_t_((ON_wString *)this);
        RemoveAllReferencePrefixDelimiters((ON_ModelComponent *)local_48,name_00);
        ON_wString::operator=((ON_wString *)this,(ON_wString *)local_48);
        ON_wString::~ON_wString((ON_wString *)local_48);
        ON_wString::TrimLeftAndRight((ON_wString *)this,(wchar_t *)0x0);
        return (ON_wString)(wchar_t *)this;
      }
      local_48._32_4_ = 0;
      local_48._36_4_ = 0;
    }
    ON_wString::ON_wString((ON_wString *)this,&ON_wString::EmptyString);
  }
  return (ON_wString)(wchar_t *)this;
}

Assistant:

const ON_wString ON_ModelComponent::NameReferencePrefix(const wchar_t * name)
{
  if (nullptr == name || 0 == name[0])
    return ON_wString::EmptyString;
  const wchar_t* tail = name;
  while (0 != *tail)
    tail++;

  while (tail > name)
  {
    tail--;
    const wchar_t* s = ON_ModelComponent::IsReferencePrefixDelimiter(tail);
    if (nullptr != s)
    {
      ON_wString name_reference = name;
      name_reference.SetLength(tail - name);
      name_reference = ON_ModelComponent::RemoveAllReferencePrefixDelimiters(name_reference);
      name_reference.TrimLeftAndRight();
      return name_reference;
    }
  }

  return ON_wString::EmptyString;  
}